

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

int __thiscall
SatPos::CalculateGEOVel
          (double tk,SatPos *this,int prn,SatPos *param_4,undefined8 param_5,undefined8 param_6,
          undefined8 param_7,double SatPosGK,double param_9,double param_10)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  Matrix<double,_3,_3> MVar4;
  Matrix<double,_3,_1> MVar5;
  undefined1 local_e8 [8];
  Vector3d V;
  Vector3d right;
  Matrix3d tmp2;
  Vector3d left;
  Matrix3d tmp1;
  Matrix3d Rzdot;
  Matrix<double,_3,_3> Rz;
  Matrix<double,_3,_3> Rx;
  double Xaxis;
  double Zaxis;
  undefined1 local_48 [8];
  Vector3d GK;
  int prn_local;
  double tk_local;
  SatPos *this_local;
  Matrix<double,_3,_1> velocity_local;
  
  GK.data._4_4_ = prn;
  this_local = param_4;
  velocity_local._0_8_ = param_5;
  Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)local_48);
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_48,0,0);
  *pdVar1 = SatPosGK;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_48,1,0);
  *pdVar1 = param_9;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_48,2,0);
  *pdVar1 = param_10;
  tk = tk * 7.292115e-05;
  dVar2 = Deg2Rad(-5.0);
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&Rz.data);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,0,0);
  *pdVar1 = 1.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,0,1);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,0,2);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,1,0);
  *pdVar1 = 0.0;
  dVar3 = cos(dVar2);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,1,1);
  *pdVar1 = dVar3;
  dVar3 = sin(dVar2);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,1,2);
  *pdVar1 = dVar3;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,2,0);
  *pdVar1 = 0.0;
  dVar3 = sin(dVar2);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,2,1);
  *pdVar1 = -dVar3;
  dVar2 = cos(dVar2);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rz.data,2,2);
  *pdVar1 = dVar2;
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&Rzdot.data);
  dVar2 = cos(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,0,0);
  *pdVar1 = dVar2;
  dVar2 = sin(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,0,1);
  *pdVar1 = dVar2;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,0,2);
  *pdVar1 = 0.0;
  dVar2 = sin(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,1,0);
  *pdVar1 = -dVar2;
  dVar2 = cos(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,1,1);
  *pdVar1 = dVar2;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,1,2);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,2,0);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,2,1);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&Rzdot.data,2,2);
  *pdVar1 = 1.0;
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&tmp1.data);
  dVar2 = sin(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,0,0);
  *pdVar1 = dVar2 * -7.292115e-05;
  dVar2 = cos(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,0,1);
  *pdVar1 = dVar2 * 7.292115e-05;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,0,2);
  *pdVar1 = 0.0;
  dVar2 = cos(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,1,0);
  *pdVar1 = dVar2 * -7.292115e-05;
  dVar2 = sin(tk);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,1,1);
  *pdVar1 = dVar2 * -7.292115e-05;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,1,2);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,2,0);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,2,1);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&tmp1.data,2,2);
  *pdVar1 = 0.0;
  MVar4 = Matrix<double,3,3>::operator*
                    ((Matrix<double,3,3> *)&tmp1.data,(Matrix<double,_3,_3> *)&Rz.data);
  tmp1._0_8_ = MVar4.data;
  left.data = MVar4._0_8_;
  MVar5 = Matrix<double,3,3>::operator*
                    ((Matrix<double,3,3> *)&left.data,(Matrix<double,_3,_1> *)local_48);
  left._0_8_ = MVar5.data;
  tmp2.data = MVar5._0_8_;
  MVar4 = Matrix<double,3,3>::operator*
                    ((Matrix<double,3,3> *)&Rzdot.data,(Matrix<double,_3,_3> *)&Rz.data);
  tmp2._0_8_ = MVar4.data;
  right.data = MVar4._0_8_;
  MVar5 = Matrix<double,3,3>::operator*
                    ((Matrix<double,3,3> *)&right.data,(Matrix<double,_3,_1> *)&this_local);
  right._0_8_ = MVar5.data;
  V.data = MVar5._0_8_;
  MVar5 = Matrix<double,_3,_1>::operator+
                    ((Matrix<double,_3,_1> *)&tmp2.data,(Matrix<double,_3,_1> *)&V.data);
  V._0_8_ = MVar5.data;
  local_e8 = MVar5._0_8_;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_e8,0,0);
  this->Bds[GK.data._4_4_].SatVelocity.X = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_e8,1,0);
  this->Bds[GK.data._4_4_].SatVelocity.Y = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_e8,2,0);
  this->Bds[GK.data._4_4_].SatVelocity.Z = *pdVar1;
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&right.data);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&left.data);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&tmp2.data);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&V.data);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_e8);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&Rzdot.data);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&Rz.data);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_48);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&tmp1.data);
  return 0;
}

Assistant:

int SatPos::CalculateGEOVel(const double tk, const XYZ SatPosGK, const int prn, const Matrix<double, 3, 1> velocity, SPPResult result)
{
    try
    {
        Vector3d GK;
        GK(0, 0) = SatPosGK.X;
        GK(1, 0) = SatPosGK.Y;
        GK(2, 0) = SatPosGK.Z;
        // GK(0, 0) = result.BDSPosi[prn].X;
        // GK(1, 0) = result.BDSPosi[prn].Y;
        // GK(2, 0) = result.BDSPosi[prn].Z;

        double Zaxis = BDSROTATIONRATE * tk;
        double Xaxis = Deg2Rad(-5.0);

        Matrix<double, 3, 3> Rx;
        Rx(0, 0) = 1;
        Rx(0, 1) = 0;
        Rx(0, 2) = 0;

        Rx(1, 0) = 0;
        Rx(1, 1) = cos(Xaxis);
        Rx(1, 2) = sin(Xaxis);

        Rx(2, 0) = 0;
        Rx(2, 1) = -sin(Xaxis);
        Rx(2, 2) = cos(Xaxis);

        Matrix<double, 3, 3> Rz;
        Rz(0, 0) = cos(Zaxis);
        Rz(0, 1) = sin(Zaxis);
        Rz(0, 2) = 0;

        Rz(1, 0) = -sin(Zaxis);
        Rz(1, 1) = cos(Zaxis);
        Rz(1, 2) = 0;

        Rz(2, 0) = 0;
        Rz(2, 1) = 0;
        Rz(2, 2) = 1;

        Matrix3d Rzdot;
        Rzdot(0, 0) = -sin(Zaxis) * BDSROTATIONRATE;
        Rzdot(0, 1) = cos(Zaxis) * BDSROTATIONRATE;
        Rzdot(0, 2) = 0;

        Rzdot(1, 0) = -cos(Zaxis) * BDSROTATIONRATE;
        Rzdot(1, 1) = -sin(Zaxis) * BDSROTATIONRATE;
        Rzdot(1, 2) = 0;

        Rzdot(2, 0) = 0;
        Rzdot(2, 1) = 0;
        Rzdot(2, 2) = 0;

        Matrix3d tmp1 = Rzdot * Rx;
        Vector3d left = tmp1 * GK;

        Matrix3d tmp2 = Rz * Rx;
        Vector3d right = tmp2 * velocity;
        Vector3d V = left + right;

        Bds[prn].SatVelocity.X = V(0, 0);
        Bds[prn].SatVelocity.Y = V(1, 0);
        Bds[prn].SatVelocity.Z = V(2, 0);

        tmp2.deleteMatrix();
        tmp1.deleteMatrix();
        left.deleteMatrix();
        right.deleteMatrix();
        V.deleteMatrix();
        Rz.deleteMatrix();
        Rx.deleteMatrix();
        GK.deleteMatrix();
        Rzdot.deleteMatrix();
    }
    catch(...)
    {
        cout << "error happened when calculate GEO vel" << endl;
        return UNKNOWN_ERROR;
    }
    
    return 0;
}